

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

free_ptr<LRQstate> scoped_calloc_or_throw<LRQstate>(void)

{
  _Rb_tree_header *p_Var1;
  LRQstate *__s;
  _Head_base<0UL,_LRQstate_*,_false> extraout_RDX;
  _Tuple_impl<1UL,_void_(*)(void_*)> in_RDI;
  free_ptr<LRQstate> fVar2;
  
  __s = calloc_or_throw<LRQstate>(1);
  p_Var1 = &(__s->lrpairs)._M_t._M_impl.super__Rb_tree_header;
  memset(__s,0,0x950);
  (__s->lrpairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__s->lrpairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  *(code **)in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       destroy_free<LRQstate>;
  *(LRQstate **)((long)in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl + 8) = __s
  ;
  fVar2._M_t.super___uniq_ptr_impl<LRQstate,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_LRQstate_*,_void_(*)(void_*)>.super__Head_base<0UL,_LRQstate_*,_false>.
  _M_head_impl = extraout_RDX._M_head_impl;
  fVar2._M_t.super___uniq_ptr_impl<LRQstate,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_LRQstate_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl;
  return (free_ptr<LRQstate>)
         fVar2._M_t.super___uniq_ptr_impl<LRQstate,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_LRQstate_*,_void_(*)(void_*)>;
}

Assistant:

free_ptr<T> scoped_calloc_or_throw()
{
  T* temp = calloc_or_throw<T>(1);
  new (temp) T();
  return std::unique_ptr<T, free_fn>(temp, destroy_free<T>);
}